

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_dirty(_glist *x,t_floatarg f)

{
  uint uVar1;
  _glist *p_Var2;
  _glist *x_00;
  uint uVar3;
  
  p_Var2 = x;
  do {
    x_00 = p_Var2;
    if (x_00->gl_owner == (_glist *)0x0) break;
    p_Var2 = x_00->gl_owner;
  } while (x_00->gl_env == (_canvasenvironment *)0x0);
  if ((pd_maininstance.pd_gui)->i_reloadingabstraction == (_glist *)0x0) {
    uVar1 = *(uint *)&x_00->field_0xe8;
    uVar3 = (uint)(long)f;
    if ((uVar3 != ((uVar1 >> 2 & 1) != 0)) &&
       (*(ushort *)&x_00->field_0xe8 = ((ushort)uVar1 & 0xfffb) + ((ushort)(long)f & 1) * 4,
       (uVar1 & 1) != 0)) {
      canvas_reflecttitle(x_00);
    }
    if (uVar3 == 0) {
      canvas_undo_cleardirty(x);
      return;
    }
  }
  return;
}

Assistant:

void canvas_dirty(t_canvas *x, t_floatarg f)
{
    t_canvas *x2 = canvas_getrootfor(x);
    unsigned int n = f;
    if (THISGUI->i_reloadingabstraction)
        return;
    if (n != x2->gl_dirty)
    {
        x2->gl_dirty = n;
        if (x2->gl_havewindow)
            canvas_reflecttitle(x2);
    }
    if(!n)
        canvas_undo_cleardirty(x);
}